

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

int json_serialize_to_buffer_r
              (JSON_Value *value,char *buf,int level,parson_bool_t is_pretty,char *num_buf)

{
  JSON_Array *pJVar1;
  JSON_Object *pJVar2;
  int level_i;
  int iVar3;
  uint uVar4;
  size_t len;
  int iVar5;
  JSON_Value *pJVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  size_t local_58;
  size_t local_50;
  
  if (value == (JSON_Value *)0x0) {
    return -1;
  }
  iVar5 = -1;
  switch(value->type) {
  case 1:
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"null",4);
    goto LAB_00187191;
  case 2:
    pcVar8 = (value->value).string.chars;
    if ((pcVar8 != (char *)0x0) &&
       (iVar5 = json_serialize_string(pcVar8,(value->value).string.length,buf), iVar5 < 0)) {
      iVar5 = -1;
    }
    break;
  case 3:
    if (buf != (char *)0x0) {
      num_buf = buf;
    }
    if (parson_number_serialization_function == (JSON_Number_Serialization_Function)0x0) {
      pcVar8 = parson_float_format;
      if (parson_float_format == (char *)0x0) {
        pcVar8 = "%1.17g";
      }
      iVar3 = sprintf(num_buf,pcVar8);
    }
    else {
      iVar3 = (*parson_number_serialization_function)((value->value).number,num_buf);
    }
    iVar5 = -1;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    break;
  case 4:
    pJVar2 = (value->value).object;
    if (pJVar2 == (JSON_Object *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = pJVar2->count;
    }
    if (buf == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      buf[0] = '{';
      buf[1] = '\0';
      pcVar8 = buf + 1;
    }
    if (is_pretty != 0 && local_50 != 0) {
      iVar5 = 2;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8[0] = '\n';
        pcVar8[1] = '\0';
        pcVar8 = pcVar8 + 1;
      }
    }
    else {
      iVar5 = 1;
    }
    for (uVar7 = 0; uVar7 != local_50; uVar7 = uVar7 + 1) {
      if (((pJVar2 == (JSON_Object *)0x0) || (pJVar2->count <= uVar7)) ||
         (pcVar9 = pJVar2->names[uVar7], pcVar9 == (char *)0x0)) {
        return -1;
      }
      if (is_pretty != 0) {
        for (iVar3 = 0; iVar3 <= level; iVar3 = iVar3 + 1) {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            builtin_strncpy(pcVar8,"    ",5);
            pcVar8 = pcVar8 + 4;
          }
          iVar5 = iVar5 + 4;
        }
      }
      len = strlen(pcVar9);
      uVar4 = json_serialize_string(pcVar9,len,pcVar8);
      if ((int)uVar4 < 0) {
        return -1;
      }
      iVar5 = iVar5 + uVar4;
      if (pcVar8 == (char *)0x0) {
        if (is_pretty != 0) {
          pcVar9 = (char *)0x0;
          goto LAB_0018747d;
        }
        iVar5 = iVar5 + 1;
        pcVar9 = (char *)0x0;
      }
      else {
        (pcVar8 + uVar4)[0] = ':';
        (pcVar8 + uVar4)[1] = '\0';
        if (is_pretty == 0) {
          iVar5 = iVar5 + 1;
          pcVar9 = pcVar8 + (ulong)uVar4 + 1;
        }
        else {
          (pcVar8 + (ulong)uVar4 + 1)[0] = ' ';
          (pcVar8 + (ulong)uVar4 + 1)[1] = '\0';
          pcVar9 = pcVar8 + (ulong)uVar4 + 2;
LAB_0018747d:
          iVar5 = iVar5 + 2;
        }
      }
      if (uVar7 < pJVar2->count) {
        pJVar6 = pJVar2->values[uVar7];
      }
      else {
        pJVar6 = (JSON_Value *)0x0;
      }
      uVar4 = json_serialize_to_buffer_r(pJVar6,pcVar9,level + 1,is_pretty,num_buf);
      if ((int)uVar4 < 0) {
        return -1;
      }
      pcVar8 = pcVar9 + uVar4;
      if (pcVar9 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      iVar5 = iVar5 + uVar4;
      if (uVar7 < local_50 - 1) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8[0] = ',';
          pcVar8[1] = '\0';
          pcVar8 = pcVar8 + 1;
        }
        iVar5 = iVar5 + 1;
      }
      if (is_pretty != 0) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8[0] = '\n';
          pcVar8[1] = '\0';
          pcVar8 = pcVar8 + 1;
        }
        iVar5 = iVar5 + 1;
      }
    }
    if (is_pretty != 0 && local_50 != 0) {
      if (level < 1) {
        level = 0;
      }
      while (bVar10 = level != 0, level = level + -1, bVar10) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar8,"    ",5);
          pcVar8 = pcVar8 + 4;
        }
        iVar5 = iVar5 + 4;
      }
    }
    if (pcVar8 != (char *)0x0) {
      pcVar8[0] = '}';
      pcVar8[1] = '\0';
    }
    goto LAB_00187557;
  case 5:
    pJVar1 = (value->value).array;
    if (pJVar1 == (JSON_Array *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = pJVar1->count;
    }
    if (buf == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      buf[0] = '[';
      buf[1] = '\0';
      pcVar8 = buf + 1;
    }
    if (is_pretty != 0 && local_58 != 0) {
      iVar5 = 2;
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        pcVar8[0] = '\n';
        pcVar8[1] = '\0';
        pcVar8 = pcVar8 + 1;
      }
    }
    else {
      iVar5 = 1;
    }
    for (uVar7 = 0; uVar7 != local_58; uVar7 = uVar7 + 1) {
      pcVar9 = pcVar8;
      if (is_pretty != 0) {
        for (iVar3 = 0; pcVar9 = pcVar8, iVar3 <= level; iVar3 = iVar3 + 1) {
          if (pcVar8 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            builtin_strncpy(pcVar8,"    ",5);
            pcVar8 = pcVar8 + 4;
          }
          iVar5 = iVar5 + 4;
        }
      }
      if ((pJVar1 == (JSON_Array *)0x0) || (pJVar1->count <= uVar7)) {
        pJVar6 = (JSON_Value *)0x0;
      }
      else {
        pJVar6 = pJVar1->items[uVar7];
      }
      uVar4 = json_serialize_to_buffer_r(pJVar6,pcVar9,level + 1,is_pretty,num_buf);
      if ((int)uVar4 < 0) {
        return -1;
      }
      pcVar8 = pcVar9 + uVar4;
      if (pcVar9 == (char *)0x0) {
        pcVar8 = pcVar9;
      }
      iVar5 = iVar5 + uVar4;
      if (uVar7 < local_58 - 1) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8[0] = ',';
          pcVar8[1] = '\0';
          pcVar8 = pcVar8 + 1;
        }
        iVar5 = iVar5 + 1;
      }
      if (is_pretty != 0) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8[0] = '\n';
          pcVar8[1] = '\0';
          pcVar8 = pcVar8 + 1;
        }
        iVar5 = iVar5 + 1;
      }
    }
    if (is_pretty != 0 && local_58 != 0) {
      if (level < 1) {
        level = 0;
      }
      while (bVar10 = level != 0, level = level + -1, bVar10) {
        if (pcVar8 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar8,"    ",5);
          pcVar8 = pcVar8 + 4;
        }
        iVar5 = iVar5 + 4;
      }
    }
    if (pcVar8 != (char *)0x0) {
      pcVar8[0] = ']';
      pcVar8[1] = '\0';
    }
LAB_00187557:
    iVar5 = iVar5 + 1;
    break;
  case 6:
    if ((value->value).boolean == 0) {
      if (buf != (char *)0x0) {
        builtin_strncpy(buf,"false",6);
        return 5;
      }
      return 5;
    }
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"true",4);
LAB_00187191:
    buf[4] = '\0';
    iVar5 = 4;
  }
  return iVar5;
}

Assistant:

static int json_serialize_to_buffer_r(const JSON_Value *value, char *buf, int level, parson_bool_t is_pretty, char *num_buf)
{
    const char *key = NULL, *string = NULL;
    JSON_Value *temp_value = NULL;
    JSON_Array *array = NULL;
    JSON_Object *object = NULL;
    size_t i = 0, count = 0;
    double num = 0.0;
    int written = -1, written_total = 0;
    size_t len = 0;

    switch (json_value_get_type(value)) {
        case JSONArray:
            array = json_value_get_array(value);
            count = json_array_get_count(array);
            APPEND_STRING("[");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                temp_value = json_array_get_value(array, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("]");
            return written_total;
        case JSONObject:
            object = json_value_get_object(value);
            count  = json_object_get_count(object);
            APPEND_STRING("{");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(object, i);
                if (key == NULL) {
                    return -1;
                }
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                /* We do not support key names with embedded \0 chars */
                written = json_serialize_string(key, strlen(key), buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                APPEND_STRING(":");
                if (is_pretty) {
                    APPEND_STRING(" ");
                }
                temp_value = json_object_get_value_at(object, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("}");
            return written_total;
        case JSONString:
            string = json_value_get_string(value);
            if (string == NULL) {
                return -1;
            }
            len = json_value_get_string_len(value);
            written = json_serialize_string(string, len, buf);
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONBoolean:
            if (json_value_get_boolean(value)) {
                APPEND_STRING("true");
            } else {
                APPEND_STRING("false");
            }
            return written_total;
        case JSONNumber:
            num = json_value_get_number(value);
            if (buf != NULL) {
                num_buf = buf;
            }
            if (parson_number_serialization_function) {
                written = parson_number_serialization_function(num, num_buf);
            } else if (parson_float_format) {
                written = sprintf(num_buf, parson_float_format, num);
            } else {
                written = sprintf(num_buf, PARSON_DEFAULT_FLOAT_FORMAT, num);
            }
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONNull:
            APPEND_STRING("null");
            return written_total;
        case JSONError:
            return -1;
        default:
            return -1;
    }
}